

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O2

void emit_vars(char *type,char *prefix,PseudoGenerator *gen,TextBuffer *mb)

{
  uint uVar1;
  uint i;
  uint uVar2;
  
  uVar1 = gen->max_reg;
  if (uVar1 != 0) {
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      if (uVar2 == 0) {
        raviX_buffer_add_fstring(mb,"%s ",type);
      }
      else {
        raviX_buffer_add_string(mb," = 0, ");
      }
      raviX_buffer_add_fstring(mb,"%s%d",prefix,(ulong)uVar2);
    }
    raviX_buffer_add_string(mb," = 0;\n");
    return;
  }
  return;
}

Assistant:

static void emit_vars(const char *type, const char *prefix, PseudoGenerator *gen, TextBuffer *mb)
{
	unsigned max_reg = raviX_max_reg(gen);
	if (max_reg == 0)
		return;
	for (unsigned i = 0; i < max_reg; i++) {
		if (i == 0) {
			raviX_buffer_add_fstring(mb, "%s ", type);
		}
		else {
			raviX_buffer_add_string(mb, " = 0, ");
		}
		raviX_buffer_add_fstring(mb, "%s%d", prefix, i);
	}
	raviX_buffer_add_string(mb, " = 0;\n");
}